

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libasd_py.cpp
# Opt level: O2

void add_read_asd(module *mod)

{
  handle hVar1;
  _Head_base<0UL,_pybind11::detail::function_record_*,_false> _Var2;
  object oVar3;
  cpp_function func;
  _Head_base<0UL,_pybind11::detail::function_record_*,_false> local_58;
  object local_50;
  handle local_48;
  char *local_40;
  undefined1 local_38;
  
  local_40 = "file_name";
  local_38 = 2;
  hVar1.m_ptr = (mod->super_object).super_handle.m_ptr;
  pybind11::none::none((none *)&local_48);
  pybind11::getattr((pybind11 *)&local_50,hVar1,"read_raw_data",local_48);
  oVar3.super_handle.m_ptr = local_50.super_handle.m_ptr;
  func.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_58);
  _Var2._M_head_impl = local_58._M_head_impl;
  (local_58._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<add_read_asd(pybind11::module_&)::$_0,pybind11::object,std::__cxx11::string_const&,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,char[81]>(add_read_asd(pybind11::module_&)::$_0&&,pybind11::object(*)(std::__cxx11::string_const&),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,pybind11::arg_const&,char_const(&)[81])
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_58._M_head_impl)->nargs_pos = 1;
  (local_58._M_head_impl)->field_0x59 = (local_58._M_head_impl)->field_0x59 & 0x9f;
  (local_58._M_head_impl)->name = "read_raw_data";
  ((local_58._M_head_impl)->scope).m_ptr = hVar1.m_ptr;
  ((local_58._M_head_impl)->sibling).m_ptr = (PyObject *)oVar3.super_handle.m_ptr;
  pybind11::detail::process_attribute<pybind11::arg,_void>::init
            ((process_attribute<pybind11::arg,_void> *)&local_40,
             (EVP_PKEY_CTX *)local_58._M_head_impl);
  (_Var2._M_head_impl)->doc =
       "This function reads `.asd` file without converting signal to height information.";
  pybind11::cpp_function::initialize_generic
            (&func,(unique_function_record *)&local_58,"({str}) -> %",
             (type_info **)
             pybind11::cpp_function::
             initialize<add_read_asd(pybind11::module_&)::$_0,pybind11::object,std::__cxx11::string_const&,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,char[81]>(add_read_asd(pybind11::module_&)::$_0&&,pybind11::object(*)(std::__cxx11::string_const&),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,pybind11::arg_const&,char_const&[])
             ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_58);
  pybind11::object::~object(&local_50);
  pybind11::object::~object((object *)&local_48);
  pybind11::module_::add_object
            (mod,"read_raw_data",(handle)func.super_function.super_object.super_handle.m_ptr,true);
  pybind11::object::~object((object *)&func);
  local_40 = "file_name";
  local_38 = 2;
  hVar1.m_ptr = (mod->super_object).super_handle.m_ptr;
  pybind11::none::none((none *)&local_48);
  pybind11::getattr((pybind11 *)&local_50,hVar1,"read_asd",local_48);
  func.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_58);
  (local_58._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<add_read_asd(pybind11::module_&)::$_1,pybind11::object,std::__cxx11::string_const&,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,char[79]>(add_read_asd(pybind11::module_&)::$_1&&,pybind11::object(*)(std::__cxx11::string_const&),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,pybind11::arg_const&,char_const(&)[79])
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_58._M_head_impl)->nargs_pos = 1;
  (local_58._M_head_impl)->field_0x59 = (local_58._M_head_impl)->field_0x59 & 0x9f;
  (local_58._M_head_impl)->name = "read_asd";
  ((local_58._M_head_impl)->scope).m_ptr = hVar1.m_ptr;
  ((local_58._M_head_impl)->sibling).m_ptr = (PyObject *)local_50.super_handle.m_ptr;
  pybind11::detail::process_attribute<pybind11::arg,_void>::init
            ((process_attribute<pybind11::arg,_void> *)&local_40,
             (EVP_PKEY_CTX *)local_58._M_head_impl);
  (local_58._M_head_impl)->doc =
       "This function reads `.asd` file after converting signal to height information.";
  pybind11::cpp_function::initialize_generic
            (&func,(unique_function_record *)&local_58,"({str}) -> %",
             (type_info **)
             pybind11::cpp_function::
             initialize<add_read_asd(pybind11::module_&)::$_1,pybind11::object,std::__cxx11::string_const&,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,char[79]>(add_read_asd(pybind11::module_&)::$_1&&,pybind11::object(*)(std::__cxx11::string_const&),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,pybind11::arg_const&,char_const&[])
             ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_58);
  pybind11::object::~object(&local_50);
  pybind11::object::~object((object *)&local_48);
  pybind11::module_::add_object
            (mod,"read_asd",(handle)func.super_function.super_object.super_handle.m_ptr,true);
  pybind11::object::~object((object *)&func);
  return;
}

Assistant:

void add_read_asd(py::module& mod) // {{{
{
    mod.def("read_raw_data",
        [](const std::string& fname) -> py::object {
            std::ifstream ifs(fname);
            if(!ifs.good())
            {
                throw std::runtime_error("file open error: " + fname);
            }

            const auto v = asd::read_version(ifs);
            switch(v)
            {
                case 0:
                {
                    if(asd::read_header<asd::version<0>>(ifs).data_type_2ch ==
                            asd::data_kind::none)
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_raw_data<
                            asd::ch<1>, asd::ver<0>, asd::container::vec>(ifs));
                    }
                    else
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_raw_data<
                            asd::ch<2>, asd::ver<0>, asd::container::vec>(ifs));
                    }
                }
                case 1:
                {
                    if(asd::read_header<asd::version<1>>(ifs).data_kind_2ch ==
                            asd::data_kind::none)
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_raw_data<
                            asd::ch<1>, asd::ver<1>, asd::container::vec>(ifs));
                    }
                    else
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_raw_data<
                            asd::ch<2>, asd::ver<1>, asd::container::vec>(ifs));
                    }
                }
                case 2:
                {
                    if(asd::read_header<asd::version<2>>(ifs).data_kind_2ch ==
                            asd::data_kind::none)
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_raw_data<
                            asd::ch<1>, asd::ver<2>, asd::container::vec>(ifs));
                    }
                    else
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_raw_data<
                            asd::ch<2>, asd::ver<2>, asd::container::vec>(ifs));
                    }
                }
                default: throw std::invalid_argument(
                             "invalid asd version: " + std::to_string(v));
            }
        },
        py::arg("file_name"),
        "This function reads `.asd` file without converting signal "
        "to height information."
        );

    mod.def("read_asd",
        [](const std::string& fname) -> py::object {
            std::ifstream ifs(fname);
            if(!ifs.good())
            {
                throw std::runtime_error("file open error: " + fname);
            }

            const auto v = asd::read_version(ifs);
            switch(v)
            {
                case 0:
                {
                    if(asd::read_header<asd::version<0>>(ifs).data_type_2ch ==
                            asd::data_kind::none)
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_asd<double,
                            asd::ch<1>, asd::ver<0>, asd::container::vec>(ifs));
                    }
                    else
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_asd<double,
                            asd::ch<2>, asd::ver<0>, asd::container::vec>(ifs));
                    }
                }
                case 1:
                {
                    if(asd::read_header<asd::version<1>>(ifs).data_kind_2ch ==
                            asd::data_kind::none)
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_asd<double,
                            asd::ch<1>, asd::ver<1>, asd::container::vec>(ifs));
                    }
                    else
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_asd<double,
                            asd::ch<2>, asd::ver<1>, asd::container::vec>(ifs));
                    }
                }
                case 2:
                {
                    if(asd::read_header<asd::version<2>>(ifs).data_kind_2ch ==
                            asd::data_kind::none)
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_asd<double,
                            asd::ch<1>, asd::ver<2>, asd::container::vec>(ifs));
                    }
                    else
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_asd<double,
                            asd::ch<2>, asd::ver<2>, asd::container::vec>(ifs));
                    }
                }
                default: throw std::invalid_argument(
                             "invalid asd version: " + std::to_string(v));
            }
        },
        py::arg("file_name"),
        "This function reads `.asd` file after converting signal "
        "to height information."
        );

    return;
}